

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_composites.cpp
# Opt level: O1

spv_result_t spvtools::val::CompositesPass(ValidationState_t *_,Instruction *inst)

{
  uint16_t uVar1;
  pointer psVar2;
  pointer psVar3;
  bool bVar4;
  bool bVar5;
  int32_t iVar6;
  uint uVar7;
  spv_result_t sVar8;
  uint32_t uVar9;
  spv_result_t sVar10;
  uint32_t uVar11;
  uint uVar12;
  Op OVar13;
  Instruction *pIVar14;
  Instruction *pIVar15;
  Instruction *pIVar16;
  DiagnosticStream *pDVar17;
  long lVar18;
  char *pcVar19;
  size_t sVar20;
  ulong uVar21;
  byte bVar22;
  uint32_t member_type;
  uint32_t result_num_cols;
  uint32_t result_component_type;
  uint32_t matrix_component_type;
  uint32_t matrix_num_cols;
  uint32_t matrix_num_rows;
  uint32_t result_num_rows;
  uint32_t matrix_col_type;
  uint32_t local_26c;
  Instruction *local_268;
  ulong local_260;
  ulong local_258;
  char *local_250;
  uint32_t local_244;
  uint32_t local_240;
  uint32_t local_23c;
  uint32_t local_238;
  uint32_t local_234;
  string local_230;
  uint32_t local_20c;
  DiagnosticStream local_208;
  
  uVar1 = (inst->inst_).opcode;
  switch(uVar1) {
  case 0x4d:
    uVar9 = (inst->inst_).type_id;
    OVar13 = ValidationState_t::GetIdOpcode(_,uVar9);
    iVar6 = spvOpcodeIsScalarType(OVar13);
    if (iVar6 == 0) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar19 = "Expected Result Type to be a scalar type";
LAB_002ce320:
      lVar18 = 0x28;
    }
    else {
      uVar11 = ValidationState_t::GetOperandTypeId(_,inst,2);
      OVar13 = ValidationState_t::GetIdOpcode(_,uVar11);
      if (OVar13 != OpTypeVector) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar19 = "Expected Vector type to be OpTypeVector";
        goto LAB_002ce3b5;
      }
      uVar11 = ValidationState_t::GetComponentType(_,uVar11);
      if (uVar11 == uVar9) {
        uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,3);
        pIVar14 = ValidationState_t::FindDef(_,uVar7);
        if (((pIVar14 == (Instruction *)0x0) || (uVar9 = (pIVar14->inst_).type_id, uVar9 == 0)) ||
           (bVar5 = ValidationState_t::IsIntScalarType(_,uVar9), !bVar5)) {
LAB_002ce438:
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar19 = "Expected Index to be int scalar";
          lVar18 = 0x1f;
        }
        else {
          bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,Shader);
          if (!bVar5) {
            return SPV_SUCCESS;
          }
          bVar5 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
          if (!bVar5) {
            return SPV_SUCCESS;
          }
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar19 = "Cannot extract from a vector of 8- or 16-bit types";
          lVar18 = 0x32;
        }
      }
      else {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar19 = "Expected Vector component type to be equal to Result Type";
        lVar18 = 0x39;
      }
    }
    break;
  case 0x4e:
    uVar9 = (inst->inst_).type_id;
    OVar13 = ValidationState_t::GetIdOpcode(_,uVar9);
    if (OVar13 == OpTypeVector) {
      uVar11 = ValidationState_t::GetOperandTypeId(_,inst,2);
      if (uVar11 == uVar9) {
        uVar11 = ValidationState_t::GetOperandTypeId(_,inst,3);
        uVar9 = ValidationState_t::GetComponentType(_,uVar9);
        if (uVar9 == uVar11) {
          uVar9 = ValidationState_t::GetOperandTypeId(_,inst,4);
          bVar5 = ValidationState_t::IsIntScalarType(_,uVar9);
          if (!bVar5) goto LAB_002ce438;
          bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,Shader);
          if (!bVar5) {
            return SPV_SUCCESS;
          }
          bVar5 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
          if (!bVar5) {
            return SPV_SUCCESS;
          }
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar19 = "Cannot insert into a vector of 8- or 16-bit types";
          lVar18 = 0x31;
        }
        else {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,"Expected Component type to be equal to Result Type ",
                     0x33);
          pcVar19 = "component type";
          lVar18 = 0xe;
        }
      }
      else {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar19 = "Expected Vector type to be equal to Result Type";
        lVar18 = 0x2f;
      }
    }
    else {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar19 = "Expected Result Type to be OpTypeVector";
LAB_002ce3b5:
      lVar18 = 0x27;
    }
    break;
  case 0x4f:
    pIVar14 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if ((pIVar14 == (Instruction *)0x0) || ((pIVar14->inst_).opcode != 0x17)) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"The Result Type of OpVectorShuffle must be",0x2a);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208," OpTypeVector. Found Op",0x17);
      local_230._M_dataplus._M_p = spvOpcodeString((uint)(pIVar14->inst_).opcode);
      pDVar17 = DiagnosticStream::operator<<(&local_208,(char **)&local_230);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar17,".",1);
      local_208.error_ = pDVar17->error_;
      goto LAB_002cedce;
    }
    psVar2 = (inst->operands_).
             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl
             .super__Vector_impl_data._M_finish;
    psVar3 = (inst->operands_).
             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar14,2);
    if (((long)psVar2 - (long)psVar3 >> 4) - 4U != (ulong)uVar7) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,
                 "OpVectorShuffle component literals count does not match Result Type <id> ",0x49);
      ValidationState_t::getIdName_abi_cxx11_(&local_230,_,(pIVar14->inst_).result_id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,local_230._M_dataplus._M_p,local_230._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"s vector component count.",0x19);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      goto LAB_002cedce;
    }
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar15 = ValidationState_t::FindDef(_,uVar7);
    pIVar15 = ValidationState_t::FindDef(_,(pIVar15->inst_).type_id);
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,3);
    pIVar16 = ValidationState_t::FindDef(_,uVar7);
    pIVar16 = ValidationState_t::FindDef(_,(pIVar16->inst_).type_id);
    if ((pIVar15 == (Instruction *)0x0) || ((pIVar15->inst_).opcode != 0x17)) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar19 = "The type of Vector 1 must be OpTypeVector.";
    }
    else {
      if ((pIVar16 != (Instruction *)0x0) && ((pIVar16->inst_).opcode == 0x17)) {
        sVar10 = Instruction::GetOperandAs<unsigned_int>(pIVar14,1);
        sVar8 = Instruction::GetOperandAs<unsigned_int>(pIVar15,1);
        if (sVar8 == sVar10) {
          sVar8 = Instruction::GetOperandAs<unsigned_int>(pIVar16,1);
          if (sVar8 == sVar10) {
            uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar15,2);
            uVar12 = Instruction::GetOperandAs<unsigned_int>(pIVar16,2);
            bVar22 = 0x40 < (ulong)((long)(inst->operands_).
                                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(inst->operands_).
                                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
            if ((bool)bVar22) {
              local_268 = (Instruction *)CONCAT44(local_268._4_4_,uVar12 + uVar7);
              local_258 = (ulong)(uVar12 + uVar7);
              sVar20 = 4;
              bVar22 = true;
              do {
                local_260 = CONCAT71(local_260._1_7_,bVar22);
                uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,sVar20);
                if ((uint)local_268 <= uVar7 && uVar7 != 0xffffffff) {
                  ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208,"Component index ",0x10);
                  std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208," is out of bounds for ",0x16);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208,"combined (Vector1 + Vector2) size of ",0x25);
                  std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,".",1);
                  sVar10 = local_208.error_;
                  DiagnosticStream::~DiagnosticStream(&local_208);
                  bVar22 = (byte)local_260;
                  break;
                }
                sVar20 = sVar20 + 1;
                bVar22 = sVar20 < (ulong)((long)(inst->operands_).
                                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(inst->operands_).
                                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 4);
              } while ((bool)bVar22);
            }
            if ((bVar22 & 1) != 0) {
              return sVar10;
            }
            bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,Shader);
            if (!bVar5) {
              return SPV_SUCCESS;
            }
            bVar5 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
            if (!bVar5) {
              return SPV_SUCCESS;
            }
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar19 = "Cannot shuffle a vector of 8- or 16-bit types";
            lVar18 = 0x2d;
            break;
          }
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar19 = "The Component Type of Vector 2 must be the same as ResultType.";
        }
        else {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar19 = "The Component Type of Vector 1 must be the same as ResultType.";
        }
        lVar18 = 0x3e;
        break;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar19 = "The type of Vector 2 must be OpTypeVector.";
    }
    goto LAB_002ced04;
  case 0x50:
    uVar21 = (long)(inst->operands_).
                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(inst->operands_).
                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4;
    sVar10 = (inst->inst_).type_id;
    OVar13 = ValidationState_t::GetIdOpcode(_,sVar10);
    uVar7 = (uint)uVar21;
    switch(OVar13) {
    case OpTypeVector:
      uVar9 = ValidationState_t::GetDimension(_,sVar10);
      uVar11 = ValidationState_t::GetComponentType(_,sVar10);
      local_268 = (Instruction *)CONCAT44(local_268._4_4_,uVar11);
      if (uVar7 < 4) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar19 = "Expected number of constituents to be at least 2";
        lVar18 = 0x30;
        goto LAB_002cebc5;
      }
      local_260 = uVar21 & 0xffffffff;
      local_258 = local_258 & 0xffffffff00000000;
      bVar5 = true;
      sVar20 = 2;
      local_240 = uVar9;
      do {
        uVar9 = ValidationState_t::GetOperandTypeId(_,inst,sVar20);
        if (uVar9 == (uint)local_268) {
          local_258 = CONCAT44(local_258._4_4_,(uint32_t)local_258 + 1);
LAB_002cea30:
          bVar4 = true;
        }
        else {
          OVar13 = ValidationState_t::GetIdOpcode(_,uVar9);
          if (OVar13 == OpTypeVector) {
            uVar11 = ValidationState_t::GetComponentType(_,uVar9);
            if (uVar11 == (uint)local_268) {
              uVar9 = ValidationState_t::GetDimension(_,uVar9);
              local_258 = CONCAT44(local_258._4_4_,(uint32_t)local_258 + uVar9);
              goto LAB_002cea30;
            }
          }
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,"Expected Constituents to be scalars or vectors of",0x31)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208," the same type as Result Type components",0x28);
          sVar10 = local_208.error_;
          DiagnosticStream::~DiagnosticStream(&local_208);
          bVar4 = false;
        }
        if (!bVar4) break;
        sVar20 = sVar20 + 1;
        bVar5 = sVar20 < local_260;
      } while (sVar20 != local_260);
      if (bVar5) goto LAB_002cebdc;
      bVar5 = true;
      if (local_240 != (uint32_t)local_258) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"Expected total number of given components to be equal ",
                   0x36);
        pcVar19 = "to the size of Result Type vector";
        lVar18 = 0x21;
        goto LAB_002cebc5;
      }
      goto LAB_002cebde;
    case OpTypeMatrix:
      local_230._M_dataplus._M_p = local_230._M_dataplus._M_p & 0xffffffff00000000;
      local_250 = (char *)((ulong)local_250 & 0xffffffff00000000);
      local_26c = 0;
      local_244 = 0;
      bVar5 = ValidationState_t::GetMatrixTypeInfo
                        (_,sVar10,(uint32_t *)&local_230,(uint32_t *)&local_250,&local_26c,
                         &local_244);
      if (!bVar5) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                      ,0x103,
                      "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                     );
      }
      if ((uint32_t)local_250 + 2 == uVar7) {
        pIVar15 = (Instruction *)(ulong)(uVar7 < 3);
        if (uVar7 >= 3) {
          pIVar15 = (Instruction *)(3 - (uVar21 & 0xffffffff));
          sVar20 = 2;
          local_268 = pIVar15;
          do {
            uVar9 = ValidationState_t::GetOperandTypeId(_,inst,sVar20);
            pIVar15 = (Instruction *)CONCAT71((int7)((ulong)pIVar15 >> 8),uVar9 == local_26c);
            if (uVar9 != local_26c) {
              local_260 = CONCAT44(local_260._4_4_,(int)pIVar15);
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,
                         "Expected Constituent type to be equal to the column ",0x34);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,"type Result Type matrix",0x17);
              sVar10 = local_208.error_;
              DiagnosticStream::~DiagnosticStream(&local_208);
              pIVar15 = (Instruction *)(local_260 & 0xffffffff);
              break;
            }
            lVar18 = (long)&(local_268->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start + sVar20;
            sVar20 = sVar20 + 1;
          } while (lVar18 != 2);
        }
      }
      else {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"Expected total number of Constituents to be equal ",0x32);
        pcVar19 = "to the number of columns of Result Type matrix";
LAB_002ced42:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar19,0x2e);
        sVar10 = local_208.error_;
        DiagnosticStream::~DiagnosticStream(&local_208);
        pIVar15 = (Instruction *)0x0;
      }
      break;
    case OpTypeImage:
    case OpTypeSampler:
    case OpTypeSampledImage:
    case OpTypeRuntimeArray:
switchD_002cde1f_caseD_19:
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar19 = "Expected Result Type to be a composite type";
LAB_002ce4e3:
      lVar18 = 0x2b;
      goto LAB_002cedbc;
    case OpTypeArray:
      pIVar14 = ValidationState_t::FindDef(_,sVar10);
      if (pIVar14 == (Instruction *)0x0) {
        __assert_fail("array_inst",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                      ,0x11a,
                      "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                     );
      }
      if ((pIVar14->inst_).opcode != 0x1c) {
        __assert_fail("array_inst->opcode() == spv::Op::OpTypeArray",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                      ,0x11b,
                      "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                     );
      }
      pIVar15 = ValidationState_t::FindDef
                          (_,(pIVar14->words_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[3]);
      iVar6 = spvOpcodeIsSpecConstant((uint)(pIVar15->inst_).opcode);
      if (iVar6 == 0) {
        local_230._M_dataplus._M_p = (char *)0x0;
        bVar5 = ValidationState_t::EvalConstantValUint64
                          (_,(pIVar14->words_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[3],(uint64_t *)&local_230);
        if (!bVar5) {
          __assert_fail("0 && \"Array type definition is corrupt\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                        ,0x125,
                        "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                       );
        }
        if (local_230._M_dataplus._M_p + 2 != (char *)(uVar21 & 0xffffffff)) {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,"Expected total number of Constituents to be equal ",0x32
                    );
          pcVar19 = "to the number of elements of Result Type array";
          goto LAB_002ced42;
        }
        pIVar15 = (Instruction *)(ulong)(uVar7 < 3);
        if (uVar7 >= 3) {
          uVar9 = (pIVar14->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[2];
          local_268 = (Instruction *)(3 - (long)(uVar21 & 0xffffffff));
          sVar20 = 2;
          local_260 = CONCAT44(local_260._4_4_,uVar9);
          do {
            uVar11 = ValidationState_t::GetOperandTypeId(_,inst,sVar20);
            bVar5 = uVar11 == uVar9;
            if (!bVar5) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,
                         "Expected Constituent type to be equal to the column ",0x34);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,"type Result Type array",0x16);
              sVar10 = local_208.error_;
              DiagnosticStream::~DiagnosticStream(&local_208);
              uVar9 = (uint32_t)local_260;
            }
            pIVar15 = (Instruction *)(ulong)bVar5;
          } while ((uVar11 == uVar9) &&
                  (lVar18 = (long)&(local_268->words_).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start + sVar20,
                  sVar20 = sVar20 + 1, lVar18 != 2));
        }
      }
      else {
        pIVar15 = (Instruction *)0x1;
      }
      break;
    case OpTypeStruct:
      pIVar14 = ValidationState_t::FindDef(_,sVar10);
      if (pIVar14 == (Instruction *)0x0) {
        __assert_fail("struct_inst",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                      ,0x13d,
                      "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                     );
      }
      if ((pIVar14->inst_).opcode != 0x1e) {
        __assert_fail("struct_inst->opcode() == spv::Op::OpTypeStruct",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                      ,0x13e,
                      "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                     );
      }
      if (((long)(pIVar14->operands_).
                 super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(pIVar14->operands_).
                 super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 4) + 1U != (uVar21 & 0xffffffff)) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"Expected total number of Constituents to be equal ",0x32);
        pcVar19 = "to the number of members of Result Type struct";
        goto LAB_002ced42;
      }
      pIVar15 = (Instruction *)(ulong)(uVar7 < 3);
      if (uVar7 >= 3) {
        local_260 = 3 - (uVar21 & 0xffffffff);
        sVar20 = 2;
        local_268 = pIVar14;
        do {
          pIVar14 = local_268;
          uVar11 = ValidationState_t::GetOperandTypeId(_,inst,sVar20);
          uVar9 = (pIVar14->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[sVar20];
          if (uVar11 != uVar9) {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,"Expected Constituent type to be equal to the ",0x2d);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,"corresponding member type of Result Type struct",0x2f)
            ;
            sVar10 = local_208.error_;
            DiagnosticStream::~DiagnosticStream(&local_208);
          }
          pIVar15 = (Instruction *)(ulong)(uVar11 == uVar9);
        } while ((uVar11 == uVar9) &&
                (lVar18 = local_260 + sVar20, sVar20 = sVar20 + 1, lVar18 != 2));
      }
      break;
    default:
      if (OVar13 == OpTypeCooperativeMatrixKHR) {
        pIVar14 = ValidationState_t::FindDef(_,sVar10);
        if (pIVar14 == (Instruction *)0x0) {
          __assert_fail("result_type_inst",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                        ,0x155,
                        "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                       );
        }
        uVar12 = Instruction::GetOperandAs<unsigned_int>(pIVar14,1);
        if (uVar7 == 3) {
LAB_002ce8a0:
          uVar9 = ValidationState_t::GetOperandTypeId(_,inst,2);
          bVar5 = uVar9 == uVar12;
          if (bVar5) goto LAB_002cebde;
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar19 = "Expected Constituent type to be equal to the component type";
          lVar18 = 0x3b;
        }
        else {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar19 = "Must be only one constituent";
          lVar18 = 0x1c;
        }
      }
      else {
        if (OVar13 != OpTypeCooperativeMatrixNV) goto switchD_002cde1f_caseD_19;
        pIVar14 = ValidationState_t::FindDef(_,sVar10);
        if (pIVar14 == (Instruction *)0x0) {
          __assert_fail("result_type_inst",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                        ,0x168,
                        "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                       );
        }
        uVar12 = Instruction::GetOperandAs<unsigned_int>(pIVar14,1);
        if (uVar7 == 3) goto LAB_002ce8a0;
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar19 = "Expected single constituent";
        lVar18 = 0x1b;
      }
LAB_002cebc5:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar19,lVar18);
      sVar10 = local_208.error_;
      DiagnosticStream::~DiagnosticStream(&local_208);
LAB_002cebdc:
      bVar5 = false;
LAB_002cebde:
      if (!bVar5) {
        return sVar10;
      }
      goto LAB_002ced64;
    }
    if ((char)pIVar15 == '\0') {
      return sVar10;
    }
LAB_002ced64:
    bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,Shader);
    if (!bVar5) {
      return SPV_SUCCESS;
    }
    bVar5 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
    if (!bVar5) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar19 = "Cannot create a composite containing 8- or 16-bit types";
    lVar18 = 0x37;
    break;
  case 0x51:
    local_26c = 0;
    sVar10 = anon_unknown_1::GetExtractInsertValueType(_,inst,&local_26c);
    uVar11 = local_26c;
    if (sVar10 != SPV_SUCCESS) {
      return sVar10;
    }
    uVar9 = (inst->inst_).type_id;
    if (uVar9 != local_26c) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"Result type (Op",0xf);
      OVar13 = ValidationState_t::GetIdOpcode(_,uVar9);
      local_230._M_dataplus._M_p = spvOpcodeString(OVar13);
      pDVar17 = DiagnosticStream::operator<<(&local_208,(char **)&local_230);
      pcVar19 = ") does not match the type that results from indexing into the composite (Op";
LAB_002ce9a9:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar17,pcVar19,0x4b);
      OVar13 = ValidationState_t::GetIdOpcode(_,uVar11);
      local_250 = spvOpcodeString(OVar13);
      pDVar17 = DiagnosticStream::operator<<(pDVar17,&local_250);
      pcVar19 = ").";
      lVar18 = 2;
      goto LAB_002ce9e9;
    }
    bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,Shader);
    if (!bVar5) {
      return SPV_SUCCESS;
    }
    bVar5 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
    if (!bVar5) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar19 = "Cannot extract from a composite of 8- or 16-bit types";
LAB_002ce3df:
    lVar18 = 0x35;
    break;
  case 0x52:
    uVar9 = ValidationState_t::GetOperandTypeId(_,inst,2);
    uVar11 = ValidationState_t::GetOperandTypeId(_,inst,3);
    if ((inst->inst_).type_id == uVar11) {
      local_26c = 0;
      sVar10 = anon_unknown_1::GetExtractInsertValueType(_,inst,&local_26c);
      uVar11 = local_26c;
      if (sVar10 != SPV_SUCCESS) {
        return sVar10;
      }
      if (uVar9 == local_26c) {
        bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,Shader);
        if (!bVar5) {
          return SPV_SUCCESS;
        }
        bVar5 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
        if (!bVar5) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar19 = "Cannot insert into a composite of 8- or 16-bit types";
        goto LAB_002ce2f6;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"The Object type (Op",0x13);
      OVar13 = ValidationState_t::GetIdOpcode(_,uVar9);
      local_230._M_dataplus._M_p = spvOpcodeString(OVar13);
      pDVar17 = DiagnosticStream::operator<<(&local_208,(char **)&local_230);
      pcVar19 = ") does not match the type that results from indexing into the Composite (Op";
      goto LAB_002ce9a9;
    }
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,"The Result Type must be the same as Composite type in Op",0x38
              );
    local_230._M_dataplus._M_p = spvOpcodeString((uint)(inst->inst_).opcode);
    pDVar17 = DiagnosticStream::operator<<(&local_208,(char **)&local_230);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar17," yielding Result Id ",0x14);
    std::ostream::_M_insert<unsigned_long>((ulong)pDVar17);
    pcVar19 = ".";
    lVar18 = 1;
LAB_002ce9e9:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar17,pcVar19,lVar18);
    local_208.error_ = pDVar17->error_;
    goto LAB_002cedce;
  case 0x53:
    uVar9 = (inst->inst_).type_id;
    uVar11 = ValidationState_t::GetOperandTypeId(_,inst,2);
    if (uVar11 == uVar9) {
      bVar5 = ValidationState_t::IsVoidType(_,uVar9);
      if (!bVar5) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar19 = "OpCopyObject cannot have void result type";
LAB_002ce943:
      lVar18 = 0x29;
    }
    else {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar19 = "Expected Result Type and Operand type to be the same";
LAB_002ce2f6:
      lVar18 = 0x34;
    }
    break;
  case 0x54:
    local_230._M_dataplus._M_p = local_230._M_dataplus._M_p & 0xffffffff00000000;
    local_250 = (char *)((ulong)local_250 & 0xffffffff00000000);
    local_26c = 0;
    local_244 = 0;
    bVar5 = ValidationState_t::GetMatrixTypeInfo
                      (_,(inst->inst_).type_id,(uint32_t *)&local_230,(uint32_t *)&local_250,
                       &local_26c,&local_244);
    if (!bVar5) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar19 = "Expected Result Type to be a matrix type";
      goto LAB_002ce320;
    }
    uVar9 = ValidationState_t::GetOperandTypeId(_,inst,2);
    local_234 = 0;
    local_238 = 0;
    local_20c = 0;
    local_23c = 0;
    bVar5 = ValidationState_t::GetMatrixTypeInfo
                      (_,uVar9,&local_234,&local_238,&local_20c,&local_23c);
    if (bVar5) {
      if (local_244 != local_23c) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"Expected component types of Matrix and Result Type to be "
                   ,0x39);
        pcVar19 = "identical";
        lVar18 = 9;
        break;
      }
      if (((uint32_t)local_230._M_dataplus._M_p != local_238) || ((uint32_t)local_250 != local_234))
      {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"Expected number of columns and the column size of Matrix "
                   ,0x39);
        pcVar19 = "to be the reverse of those of Result Type";
        goto LAB_002ce943;
      }
      bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,Shader);
      if (!bVar5) {
        return SPV_SUCCESS;
      }
      bVar5 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
      if (!bVar5) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar19 = "Cannot transpose matrices of 16-bit floats";
    }
    else {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar19 = "Expected Matrix to be of type OpTypeMatrix";
    }
LAB_002ced04:
    lVar18 = 0x2a;
    break;
  default:
    if (uVar1 != 400) {
      return SPV_SUCCESS;
    }
    pIVar14 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar15 = ValidationState_t::FindDef(_,uVar7);
    pIVar15 = ValidationState_t::FindDef(_,(pIVar15->inst_).type_id);
    if (((pIVar15 == pIVar14) || (pIVar14 == (Instruction *)0x0)) || (pIVar15 == (Instruction *)0x0)
       ) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar19 = "Result Type must not equal the Operand type";
      goto LAB_002ce4e3;
    }
    bVar5 = ValidationState_t::LogicallyMatch(_,pIVar15,pIVar14,false);
    if (!bVar5) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar19 = "Result Type does not logically match the Operand type";
      goto LAB_002ce3df;
    }
    bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,Shader);
    if (!bVar5) {
      return SPV_SUCCESS;
    }
    bVar5 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
    if (!bVar5) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar19 = "Cannot copy composites of 8- or 16-bit types";
    lVar18 = 0x2c;
  }
LAB_002cedbc:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar19,lVar18);
LAB_002cedce:
  DiagnosticStream::~DiagnosticStream(&local_208);
  return local_208.error_;
}

Assistant:

spv_result_t CompositesPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpVectorExtractDynamic:
      return ValidateVectorExtractDynamic(_, inst);
    case spv::Op::OpVectorInsertDynamic:
      return ValidateVectorInsertDyanmic(_, inst);
    case spv::Op::OpVectorShuffle:
      return ValidateVectorShuffle(_, inst);
    case spv::Op::OpCompositeConstruct:
      return ValidateCompositeConstruct(_, inst);
    case spv::Op::OpCompositeExtract:
      return ValidateCompositeExtract(_, inst);
    case spv::Op::OpCompositeInsert:
      return ValidateCompositeInsert(_, inst);
    case spv::Op::OpCopyObject:
      return ValidateCopyObject(_, inst);
    case spv::Op::OpTranspose:
      return ValidateTranspose(_, inst);
    case spv::Op::OpCopyLogical:
      return ValidateCopyLogical(_, inst);
    default:
      break;
  }

  return SPV_SUCCESS;
}